

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

int ipc_helper_bind_twice(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  uv_pipe_t *unaff_RBX;
  uv_pipe_t *__size;
  sockaddr_in addr;
  undefined1 auStack_40 [16];
  uv_pipe_t *puStack_30;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  puStack_30 = (uv_pipe_t *)0x162f85;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_18);
  if (iVar1 == 0) {
    puStack_30 = (uv_pipe_t *)0x162f92;
    uVar2 = uv_default_loop();
    puStack_30 = (uv_pipe_t *)0x162fa6;
    iVar1 = uv_pipe_init(uVar2,&channel,1);
    if (iVar1 != 0) goto LAB_0016312f;
    unaff_RBX = &channel;
    puStack_30 = (uv_pipe_t *)0x162fbf;
    uv_pipe_open(&channel,0);
    puStack_30 = (uv_pipe_t *)0x162fc7;
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_00163134;
    puStack_30 = (uv_pipe_t *)0x162fdc;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_00163139;
    puStack_30 = (uv_pipe_t *)0x162ff1;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_0016313e;
    puStack_30 = (uv_pipe_t *)0x16300a;
    local_28 = uv_buf_init("hello\n",6);
    puStack_30 = (uv_pipe_t *)0x163018;
    uVar2 = uv_default_loop();
    puStack_30 = (uv_pipe_t *)0x163027;
    iVar1 = uv_tcp_init(uVar2,&tcp_server);
    if (iVar1 != 0) goto LAB_00163143;
    puStack_30 = (uv_pipe_t *)0x163034;
    uVar2 = uv_default_loop();
    puStack_30 = (uv_pipe_t *)0x163043;
    iVar1 = uv_tcp_init(uVar2,&tcp_server2);
    if (iVar1 != 0) goto LAB_00163148;
    puStack_30 = (uv_pipe_t *)0x16305e;
    iVar1 = uv_tcp_bind(&tcp_server,local_18,0);
    if (iVar1 != 0) goto LAB_0016314d;
    puStack_30 = (uv_pipe_t *)0x163079;
    iVar1 = uv_tcp_bind(&tcp_server2,local_18,0);
    if (iVar1 != 0) goto LAB_00163152;
    puStack_30 = (uv_pipe_t *)0x1630a6;
    iVar1 = uv_write2(&write_req,&channel,local_28,1,&tcp_server,0);
    if (iVar1 != 0) goto LAB_00163157;
    puStack_30 = (uv_pipe_t *)0x1630d3;
    iVar1 = uv_write2(&write_req2,&channel,local_28,1,&tcp_server2,0);
    if (iVar1 != 0) goto LAB_0016315c;
    puStack_30 = (uv_pipe_t *)0x1630e0;
    uVar2 = uv_default_loop();
    puStack_30 = (uv_pipe_t *)0x1630ea;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_00163161;
    puStack_30 = (uv_pipe_t *)0x1630f3;
    unaff_RBX = (uv_pipe_t *)uv_default_loop();
    puStack_30 = (uv_pipe_t *)0x163107;
    uv_walk(unaff_RBX,close_walk_cb,0);
    puStack_30 = (uv_pipe_t *)0x163111;
    uv_run(unaff_RBX,0);
    puStack_30 = (uv_pipe_t *)0x163116;
    uVar2 = uv_default_loop();
    puStack_30 = (uv_pipe_t *)0x16311e;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_30 = (uv_pipe_t *)0x16312f;
    ipc_helper_bind_twice_cold_1();
LAB_0016312f:
    puStack_30 = (uv_pipe_t *)0x163134;
    ipc_helper_bind_twice_cold_2();
LAB_00163134:
    puStack_30 = (uv_pipe_t *)0x163139;
    ipc_helper_bind_twice_cold_3();
LAB_00163139:
    puStack_30 = (uv_pipe_t *)0x16313e;
    ipc_helper_bind_twice_cold_4();
LAB_0016313e:
    puStack_30 = (uv_pipe_t *)0x163143;
    ipc_helper_bind_twice_cold_5();
LAB_00163143:
    puStack_30 = (uv_pipe_t *)0x163148;
    ipc_helper_bind_twice_cold_6();
LAB_00163148:
    puStack_30 = (uv_pipe_t *)0x16314d;
    ipc_helper_bind_twice_cold_7();
LAB_0016314d:
    puStack_30 = (uv_pipe_t *)0x163152;
    ipc_helper_bind_twice_cold_8();
LAB_00163152:
    puStack_30 = (uv_pipe_t *)0x163157;
    ipc_helper_bind_twice_cold_9();
LAB_00163157:
    puStack_30 = (uv_pipe_t *)0x16315c;
    ipc_helper_bind_twice_cold_10();
LAB_0016315c:
    puStack_30 = (uv_pipe_t *)0x163161;
    ipc_helper_bind_twice_cold_11();
LAB_00163161:
    puStack_30 = (uv_pipe_t *)0x163166;
    ipc_helper_bind_twice_cold_12();
  }
  puStack_30 = (uv_pipe_t *)ipc_helper_send_zero;
  ipc_helper_bind_twice_cold_13();
  puStack_30 = unaff_RBX;
  auStack_40 = uv_buf_init(0,0);
  uVar2 = uv_default_loop();
  __size = &channel;
  iVar1 = uv_pipe_init(uVar2,&channel,0);
  if (iVar1 == 0) {
    __size = (uv_pipe_t *)0x0;
    uv_pipe_open(&channel);
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_0016326e;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_00163273;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_00163278;
    __size = &channel;
    iVar1 = uv_write(&write_req,&channel,auStack_40,1,send_zero_write_cb);
    if (iVar1 != 0) goto LAB_0016327d;
    uVar2 = uv_default_loop();
    __size = (uv_pipe_t *)0x0;
    iVar1 = uv_run(uVar2);
    if (iVar1 != 0) goto LAB_00163282;
    if (send_zero_write == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      __size = (uv_pipe_t *)0x0;
      uv_run(uVar2);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016328c;
    }
  }
  else {
    ipc_helper_send_zero_cold_1();
LAB_0016326e:
    ipc_helper_send_zero_cold_2();
LAB_00163273:
    ipc_helper_send_zero_cold_3();
LAB_00163278:
    ipc_helper_send_zero_cold_4();
LAB_0016327d:
    ipc_helper_send_zero_cold_5();
LAB_00163282:
    ipc_helper_send_zero_cold_6();
  }
  ipc_helper_send_zero_cold_7();
LAB_0016328c:
  ipc_helper_send_zero_cold_8();
  if ((int)__size == 0) {
    send_zero_write = send_zero_write + 1;
    return extraout_EAX;
  }
  send_zero_write_cb_cold_1();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = __size;
  return (int)pvVar3;
}

Assistant:

int ipc_helper_bind_twice(void) {
  /*
   * This is launched from test-ipc.c. stdin is a duplex channel
   * over which two handles will be transmitted.
   */
  struct sockaddr_in addr;
  int r;
  uv_buf_t buf;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_pipe_init(uv_default_loop(), &channel, 1);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  buf = uv_buf_init("hello\n", 6);

  r = uv_tcp_init(uv_default_loop(), &tcp_server);
  ASSERT(r == 0);
  r = uv_tcp_init(uv_default_loop(), &tcp_server2);
  ASSERT(r == 0);

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_tcp_bind(&tcp_server2, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_write2(&write_req, (uv_stream_t*)&channel, &buf, 1,
                (uv_stream_t*)&tcp_server, NULL);
  ASSERT(r == 0);
  r = uv_write2(&write_req2, (uv_stream_t*)&channel, &buf, 1,
                (uv_stream_t*)&tcp_server2, NULL);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}